

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

void __thiscall duckdb::LimitGlobalState::~LimitGlobalState(LimitGlobalState *this)

{
  ~LimitGlobalState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit LimitGlobalState(ClientContext &context, const PhysicalLimit &op) : data(context, op.types, true) {
		limit = 0;
		offset = 0;
	}